

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenkoFPM.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenkoFPM::ComputeConsistentMassMatrix
          (ChElementBeamTaperedTimoshenkoFPM *this)

{
  ChMatrixDynamic<> *this_00;
  BeamTaperedTimoshenkoFPM myformula;
  ChMatrixNM<double,_12,_12> TempMassMatrix;
  double local_520;
  ChIntegrable1D<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> local_518;
  ChElementBeamTaperedTimoshenkoFPM *local_510;
  undefined4 local_508;
  DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> local_500 [1240];
  
  this_00 = &(this->super_ChElementBeamTaperedTimoshenko).M;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this_00);
  local_518._vptr_ChIntegrable1D = (_func_int **)&PTR__ChIntegrable1D_0117e990;
  local_508 = 2;
  local_510 = this;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero(local_500);
  ChQuadrature::Integrate1D<Eigen::Matrix<double,12,12,1,12,12>>
            ((Matrix<double,_12,_12,_1,_12,_12> *)local_500,&local_518,-1.0,1.0,this->guass_order);
  local_520 = (this->super_ChElementBeamTaperedTimoshenko).super_ChElementBeam.length * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::operator*=(local_500,&local_520);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,12,12,1,12,12>>
            (this_00,(Matrix<double,_12,_12,_1,_12,_12> *)local_500);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenkoFPM::ComputeConsistentMassMatrix() {
    // Calculate the local element mass matrix via Guass integration
    this->M.setZero();
    BeamTaperedTimoshenkoFPM myformula(this, 2);  // 2: mass matrix
    ChMatrixNM<double, 12, 12> TempMassMatrix;
    TempMassMatrix.setZero();
    ChQuadrature::Integrate1D<ChMatrixNM<double, 12, 12>>(TempMassMatrix,  // result of integration will go there
                                                          myformula,       // formula to integrate
                                                          -1, 1,           // x limits
                                                          guass_order      // order of integration
    );
    // eta = 2*x/L;
    // ---> Deta/dx = 2./L;
    // ---> detJ = dx/Deta = L/2.;
    TempMassMatrix *= this->length / 2.0;  // need to multiple detJ
    this->M = TempMassMatrix;
    // If the cross-sectional mass properties are given at the mass center,
    // then it should be transformed to the centerline firstly,
    // this is handled in the Class ChBeamSectionTimoshenkoAdvancedGenericFPM. NOT HERE.
}